

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void percent_rankValueFunc(sqlite3_context *pCtx)

{
  Mem *p;
  long *plVar1;
  
  if ((pCtx->pMem->flags & 0x2000) == 0) {
    plVar1 = (long *)createAggContext(pCtx,0x18);
  }
  else {
    plVar1 = (long *)pCtx->pMem->z;
  }
  if (plVar1 != (long *)0x0) {
    *plVar1 = plVar1[1];
    if (1 < plVar1[2]) {
      sqlite3VdbeMemSetDouble(pCtx->pOut,(double)plVar1[1] / (double)(plVar1[2] + -1));
      return;
    }
    p = pCtx->pOut;
    if ((p->flags & 0x2400) == 0) {
      p->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(p);
    }
    (p->u).r = 0.0;
    p->flags = 8;
  }
  return;
}

Assistant:

static void percent_rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    p->nValue = p->nStep;
    if( p->nTotal>1 ){
      double r = (double)p->nValue / (double)(p->nTotal-1);
      sqlite3_result_double(pCtx, r);
    }else{
      sqlite3_result_double(pCtx, 0.0);
    }
  }
}